

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

SharedTyPtr __thiscall mir::inst::Variable::type(Variable *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  SharedTyPtr SVar3;
  undefined1 local_29;
  Displayable local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  shared_ptr<mir::types::Ty> local_18;
  
  if (*(char *)(in_RSI + 0x18) == '\x01') {
    local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(in_RSI + 8);
    local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
    if (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_28._vptr_Displayable = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mir::types::PtrTy,std::allocator<mir::types::PtrTy>,std::shared_ptr<mir::types::Ty>&>
              (&_Stack_20,(PtrTy **)&local_28,(allocator<mir::types::PtrTy> *)&local_29,&local_18);
    _Var2._M_pi = _Stack_20._M_pi;
    (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Displayable)._vptr_Displayable = local_28._vptr_Displayable;
    (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var2._M_pi;
    local_28._vptr_Displayable = (_func_int **)0x0;
    in_RDX._M_pi = extraout_RDX;
    if (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_18.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  else {
    (this->super_Displayable)._vptr_Displayable = *(_func_int ***)(in_RSI + 8);
    peVar1 = *(element_type **)(in_RSI + 0x10);
    (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    if (peVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&peVar1[1].super_Displayable._vptr_Displayable =
             *(int *)&peVar1[1].super_Displayable._vptr_Displayable + 1;
        UNLOCK();
      }
      else {
        *(int *)&peVar1[1].super_Displayable._vptr_Displayable =
             *(int *)&peVar1[1].super_Displayable._vptr_Displayable + 1;
      }
    }
  }
  SVar3.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar3.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedTyPtr)SVar3.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

types::SharedTyPtr type() const {
    if (is_memory_var) {
      return types::new_ptr_ty(ty);
    } else {
      return ty;
    }
  }